

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pembase64.c
# Opt level: O1

int ptls_base64_decode(char *text,ptls_base64_decode_state_t *state,ptls_buffer_t *buf)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  byte bVar4;
  size_t len;
  uint uVar5;
  size_t sVar6;
  long lVar7;
  char *pcVar8;
  uint8_t decoded [3];
  undefined1 local_33 [3];
  
  lVar7 = 0;
  while (((ulong)(byte)text[lVar7] < 0x21 &&
         ((0x100002600U >> ((ulong)(byte)text[lVar7] & 0x3f) & 1) != 0))) {
    lVar7 = lVar7 + 1;
  }
  bVar4 = text[lVar7];
  if (bVar4 == 0) {
LAB_00107f4a:
    iVar3 = 0;
  }
  else {
    do {
      if (state->status != 1) goto LAB_00107f4a;
      uVar5 = 0xffffffff;
      if (bVar4 < 0x7f) {
        uVar5 = (uint)ptls_base64_values[(char)bVar4];
      }
      iVar3 = state->nbc;
      if (uVar5 == 0xffffffff) {
        if ((bVar4 == 0x3d && iVar3 == 2) && (text[lVar7 + 1] == '=')) {
          state->nbc = 4;
          state->nbo = 1;
          state->v = state->v << 0xc;
          lVar7 = lVar7 + 2;
          iVar3 = 0;
          bVar2 = true;
        }
        else {
          if (bVar4 == 0x3d && iVar3 == 3) {
            state->nbc = 4;
            state->nbo = 2;
            state->v = state->v << 6;
            goto LAB_00107e22;
          }
          for (; (bVar4 = text[lVar7], bVar4 - 9 < 5 || (bVar4 == 0x20)); lVar7 = lVar7 + 1) {
          }
          if (bVar4 == 0) goto LAB_00107f4a;
          state->nbo = 0;
          state->status = -1;
          iVar3 = 0x232;
          bVar2 = false;
        }
      }
      else {
        state->nbc = iVar3 + 1;
        state->v = state->v << 6 | uVar5;
LAB_00107e22:
        iVar3 = 0;
        bVar2 = true;
        lVar7 = lVar7 + 1;
      }
      if ((bVar2) && (iVar3 = 0, state->nbc == 4)) {
        len = (size_t)state->nbo;
        if (0 < (long)len) {
          uVar5 = state->v;
          bVar4 = 0x10;
          sVar6 = 0;
          do {
            local_33[sVar6] = (char)(uVar5 >> (bVar4 & 0x1f));
            sVar6 = sVar6 + 1;
            bVar4 = bVar4 - 8;
          } while (len != sVar6);
        }
        iVar3 = ptls_buffer__do_pushv(buf,local_33,len);
        if (iVar3 != 0) goto LAB_00107e8a;
        if (2 < state->nbo) {
          state->v = 0;
          state->nbc = 0;
          state->nbo = 3;
          iVar3 = 0;
          goto LAB_00107e8a;
        }
        pcVar8 = text + lVar7;
        do {
          cVar1 = *pcVar8;
          pcVar8 = pcVar8 + 1;
        } while (cVar1 != '\0');
        state->status = 0;
        goto LAB_00107f4a;
      }
LAB_00107e8a:
    } while ((iVar3 == 0) && (bVar4 = text[lVar7], bVar4 != 0));
  }
  return iVar3;
}

Assistant:

int ptls_base64_decode(const char *text, ptls_base64_decode_state_t *state, ptls_buffer_t *buf)
{
    int ret = 0;
    uint8_t decoded[3];
    size_t text_index = 0;
    int c;
    signed char vc;

    /* skip initial blanks */
    while (text[text_index] != 0) {
        c = text[text_index];

        if (c == ' ' || c == '\t' || c == '\r' || c == '\n') {
            text_index++;
        } else {
            break;
        }
    }

    while (text[text_index] != 0 && ret == 0 && state->status == PTLS_BASE64_DECODE_IN_PROGRESS) {
        c = text[text_index++];

        vc = 0 < c && c < 0x7f ? ptls_base64_values[c] : -1;
        if (vc == -1) {
            if (state->nbc == 2 && c == '=' && text[text_index] == '=') {
                state->nbc = 4;
                text_index++;
                state->nbo = 1;
                state->v <<= 12;
            } else if (state->nbc == 3 && c == '=') {
                state->nbc = 4;
                state->nbo = 2;
                state->v <<= 6;
            } else {
                /* Skip final blanks */
                for (--text_index; text[text_index] != 0; ++text_index) {
                    c = text[text_index];
                    if (!(c == ' ' || c == '\t' || c == '\r' || c == '\n' || c == 0x0B || c == 0x0C))
                        break;
                }

                /* Should now be at end of buffer */
                if (text[text_index] == 0) {
                    break;
                } else {
                    /* Not at end of buffer, signal a decoding error */
                    state->nbo = 0;
                    state->status = PTLS_BASE64_DECODE_FAILED;
                    ret = PTLS_ERROR_INCORRECT_BASE64;
                }
            }
        } else {
            state->nbc++;
            state->v <<= 6;
            state->v |= vc;
        }

        if (ret == 0 && state->nbc == 4) {
            /* Convert to up to 3 octets */
            for (int j = 0; j < state->nbo; j++) {
                decoded[j] = (uint8_t)(state->v >> (8 * (2 - j)));
            }

            ret = ptls_buffer__do_pushv(buf, decoded, state->nbo);

            if (ret == 0) {
                /* test for fin or continuation */
                if (state->nbo < 3) {
                    /* Check that there are only trainling blanks on this line */
                    while (text[text_index] != 0) {
                        c = text[text_index++];

                        if (c == ' ' || c == '\t' || c == '\r' || c == '\n' || c == 0x0B || c == 0x0C) {
                            continue;
                        }
                    }
                    if (text[text_index] == 0) {
                        state->status = PTLS_BASE64_DECODE_DONE;
                    } else {
                        state->status = PTLS_BASE64_DECODE_FAILED;
                        ret = PTLS_ERROR_INCORRECT_BASE64;
                    }
                    break;
                } else {
                    state->v = 0;
                    state->nbo = 3;
                    state->nbc = 0;
                }
            }
        }
    }
    return ret;
}